

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.cpp
# Opt level: O0

ostream * soplex::operator<<(ostream *os,SPxId *id)

{
  Type TVar1;
  SPxInternalCodeException *this;
  ostream *poVar2;
  SPxId *in_RSI;
  ostream *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [32];
  SPxId *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  TVar1 = SPxId::type(in_RSI);
  if (TVar1 == ROW_ID) {
    std::operator<<(local_8,"row ");
  }
  else if (TVar1 == INVALID) {
    std::operator<<(local_8,"Invalid ");
  }
  else {
    if (TVar1 != COL_ID) {
      this = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"XSPXID01 This should never happen.",&local_31);
      SPxInternalCodeException::SPxInternalCodeException(this,in_stack_ffffffffffffff98);
      __cxa_throw(this,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    std::operator<<(local_8,"col ");
  }
  poVar2 = (ostream *)std::ostream::operator<<(local_8,(local_10->super_DataKey).idx);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_10->super_DataKey).info);
  std::operator<<(poVar2,")");
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SPxId& id)
{
   switch(id.type())
   {
   case SPxId::ROW_ID:
      os << "row ";
      break;

   case SPxId::COL_ID :
      os << "col ";
      break;

   case SPxId::INVALID :
      os << "Invalid ";
      break;

   default :
      throw SPxInternalCodeException("XSPXID01 This should never happen.");
   }

   os << id.idx << " (" << id.info << ")";

   return os;
}